

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<long_long,_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::ModulusSimpleCase(long lhs,
                        SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            *result)

{
  bool bVar1;
  longlong lVar2;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RSI
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDI
  ;
  int in_stack_ffffffffffffffbc;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc0;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffc8;
  
  bVar1 = ::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
            ::SignedCase(in_stack_ffffffffffffffc8,
                         (SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)in_stack_ffffffffffffffc0.m_int);
    if (!bVar1) {
      lVar2 = ::SafeInt::operator_cast_to_long_long(in_RDI);
      SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
      operator=(in_RSI,(longlong *)((long)in_RDI % lVar2));
    }
    return true;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }